

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O3

Component __thiscall
ftxui::Slider<float>
          (ftxui *this,ConstStringRef *label,float *value,float min,float max,float increment)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_35;
  float increment_local;
  float max_local;
  float min_local;
  SliderBase<float> *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  float *value_local;
  
  local_28 = (SliderBase<float> *)0x0;
  increment_local = increment;
  max_local = max;
  min_local = min;
  value_local = value;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ftxui::SliderBase<float>,std::allocator<ftxui::SliderBase<float>>,ftxui::ConstStringRef&,float*&,float&,float&,float&>
            (&_Stack_20,&local_28,(allocator<ftxui::SliderBase<float>_> *)&local_35,label,
             &value_local,&min_local,&max_local,&increment_local);
  *(SliderBase<float> **)this = local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Stack_20._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Slider(ConstStringRef label, T* value, T min, T max, T increment) {
  return Make<SliderBase<T>>(std::move(label), value, min, max, increment);
}